

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O0

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int i_5;
  float norm_var_inv_1;
  float norm_var_1;
  float sqmean_1;
  float *outptr_3;
  int q_7;
  int i_4;
  float *outptr_2;
  int q_6;
  float norm_var_inv;
  float norm_var;
  int q_5;
  float sqmean;
  int i_3;
  float s_1;
  float *ptr_3;
  int q_4;
  Mat sqsum;
  int i_2;
  float mean_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  int q_1;
  float mean;
  int i;
  float s;
  float *ptr;
  int q;
  Mat sum;
  int size;
  int channels;
  int h;
  int w;
  int in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  float in_stack_fffffffffffffc84;
  Mat *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  int local_2d0;
  Mat local_2c0;
  float *local_290;
  int local_288;
  int local_284;
  Mat local_280;
  float *local_250;
  int local_244;
  float local_240;
  float local_23c;
  int local_238;
  float local_234;
  int local_230;
  float local_22c;
  Mat local_228;
  float *local_1f8;
  int local_1ec;
  Mat local_1e8;
  int local_1b8;
  float local_1b4;
  Mat local_1b0;
  float *local_180;
  Mat local_178;
  float *local_148;
  int local_140;
  int local_13c;
  Mat local_138;
  float *local_108;
  Mat local_100;
  float *local_d0;
  int local_c4;
  int local_c0;
  float local_bc;
  int local_b8;
  float local_b4;
  Mat local_b0;
  float *local_80;
  int local_74;
  int local_70;
  Mat local_60;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x1c);
  local_28 = *(int *)(in_RSI + 0x20);
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = local_24 * local_28;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
              (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),(int)in_stack_fffffffffffffc98,
              (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),(size_t)in_stack_fffffffffffffc88);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  if (bVar2) {
    return -100;
  }
  Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
           in_stack_fffffffffffffc7c,0x11b7e7);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  if (bVar2) {
    local_4 = -100;
    local_70 = 1;
  }
  else {
    for (local_74 = 0; local_74 < local_2c; local_74 = local_74 + 1) {
      Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
      pfVar3 = Mat::operator_cast_to_float_(&local_b0);
      Mat::~Mat((Mat *)0x11b89f);
      local_b4 = 0.0;
      for (local_b8 = 0; fVar1 = local_b4, local_b8 < local_30; local_b8 = local_b8 + 1) {
        local_b4 = pfVar3[local_b8] + local_b4;
      }
      local_80 = pfVar3;
      pfVar3 = Mat::operator[](&local_60,local_74);
      *pfVar3 = fVar1;
    }
    if (*(int *)(in_RDI + 0x84) == 0) {
      for (local_140 = 0; local_140 < local_2c; local_140 = local_140 + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
        pfVar3 = Mat::operator_cast_to_float_(&local_178);
        Mat::~Mat((Mat *)0x11bc28);
        local_148 = pfVar3;
        Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
        pfVar3 = Mat::operator_cast_to_float_(&local_1b0);
        Mat::~Mat((Mat *)0x11bc74);
        local_180 = pfVar3;
        pfVar3 = Mat::operator[](&local_60,local_140);
        local_1b4 = *pfVar3 / (float)local_30;
        for (local_1b8 = 0; local_1b8 < local_30; local_1b8 = local_1b8 + 1) {
          local_180[local_1b8] = local_148[local_1b8] - local_1b4;
        }
      }
    }
    else {
      local_bc = 0.0;
      for (local_c0 = 0; local_c0 < local_2c; local_c0 = local_c0 + 1) {
        pfVar3 = Mat::operator[](&local_60,local_c0);
        local_bc = *pfVar3 + local_bc;
      }
      local_bc = local_bc / (float)(local_2c * local_30);
      for (local_c4 = 0; local_c4 < local_2c; local_c4 = local_c4 + 1) {
        Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
        pfVar3 = Mat::operator_cast_to_float_(&local_100);
        Mat::~Mat((Mat *)0x11baa3);
        local_d0 = pfVar3;
        Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
        pfVar3 = Mat::operator_cast_to_float_(&local_138);
        Mat::~Mat((Mat *)0x11baef);
        for (local_13c = 0; local_13c < local_30; local_13c = local_13c + 1) {
          pfVar3[local_13c] = local_d0[local_13c] - local_bc;
        }
        local_108 = pfVar3;
      }
    }
    if (*(int *)(in_RDI + 0x80) != 0) {
      Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c,0x11bdb4);
      bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      if (bVar2) {
        local_4 = -100;
        local_70 = 1;
      }
      else {
        for (local_1ec = 0; local_1ec < local_2c; local_1ec = local_1ec + 1) {
          Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
          pfVar3 = Mat::operator_cast_to_float_(&local_228);
          Mat::~Mat((Mat *)0x11be65);
          local_22c = 0.0;
          for (local_230 = 0; fVar1 = local_22c, local_230 < local_30; local_230 = local_230 + 1) {
            local_22c = pfVar3[local_230] * pfVar3[local_230] + local_22c;
          }
          local_1f8 = pfVar3;
          pfVar3 = Mat::operator[](&local_1e8,local_1ec);
          *pfVar3 = fVar1;
        }
        if (*(int *)(in_RDI + 0x84) == 0) {
          for (local_288 = 0; local_288 < local_2c; local_288 = local_288 + 1) {
            Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
            pfVar3 = Mat::operator_cast_to_float_(&local_2c0);
            Mat::~Mat((Mat *)0x11c1c9);
            local_290 = pfVar3;
            in_stack_fffffffffffffc88 = (Mat *)Mat::operator[](&local_1e8,local_288);
            dVar4 = std::sqrt((double)(ulong)(uint)(*(float *)&in_stack_fffffffffffffc88->data /
                                                   (float)local_30));
            in_stack_fffffffffffffc84 = SUB84(dVar4,0);
            fVar1 = *(float *)(in_RDI + 0x88);
            for (local_2d0 = 0; local_2d0 < local_30; local_2d0 = local_2d0 + 1) {
              local_290[local_2d0] =
                   local_290[local_2d0] * (1.0 / (in_stack_fffffffffffffc84 + fVar1));
            }
          }
        }
        else {
          local_234 = 0.0;
          for (local_238 = 0; local_238 < local_2c; local_238 = local_238 + 1) {
            pfVar3 = Mat::operator[](&local_1e8,local_238);
            local_234 = *pfVar3 + local_234;
          }
          local_234 = local_234 / (float)(local_2c * local_30);
          dVar4 = std::sqrt((double)(ulong)(uint)local_234);
          local_23c = SUB84(dVar4,0) + *(float *)(in_RDI + 0x88);
          local_240 = 1.0 / local_23c;
          for (local_244 = 0; local_244 < local_2c; local_244 = local_244 + 1) {
            Mat::channel(in_stack_fffffffffffffc88,(int)in_stack_fffffffffffffc84);
            pfVar3 = Mat::operator_cast_to_float_(&local_280);
            Mat::~Mat((Mat *)0x11c0ba);
            for (local_284 = 0; local_284 < local_30; local_284 = local_284 + 1) {
              pfVar3[local_284] = pfVar3[local_284] * local_240;
            }
            local_250 = pfVar3;
          }
        }
        local_70 = 0;
      }
      Mat::~Mat((Mat *)0x11c315);
      if (local_70 != 0) goto LAB_0011c349;
    }
    local_4 = 0;
    local_70 = 1;
  }
LAB_0011c349:
  Mat::~Mat((Mat *)0x11c356);
  return local_4;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    top_blob.create(w, h, channels);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels);
    if (sum.empty())
        return -100;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}